

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

Pseudo * instruct_move(Proc *proc,opcode op,Pseudo *target,Pseudo *src,uint line_number)

{
  C_MemoryAllocator *pCVar1;
  undefined1 *ptr;
  Pseudo *pseudo;
  
  pCVar1 = proc->linearizer->compiler_state->allocator;
  ptr = (undefined1 *)(*pCVar1->calloc)(pCVar1->arena,1,0x28);
  *ptr = (char)op;
  *(uint *)(ptr + 0x20) = line_number;
  if (((undefined1  [48])*src & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    pseudo = indexed_load(proc,src);
    src = pseudo;
  }
  else {
    pseudo = (Pseudo *)0x0;
  }
  raviX_ptrlist_add((PtrList **)(ptr + 8),src,proc->linearizer->compiler_state->allocator);
  if (((undefined1  [48])*target & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
    raviX_ptrlist_add((PtrList **)(ptr + 0x10),target,proc->linearizer->compiler_state->allocator);
    if ((*(BasicBlock **)(ptr + 0x18) != (BasicBlock *)0x0) &&
       (*(BasicBlock **)(ptr + 0x18) != proc->current_bb)) {
      __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                    ,0x1b1,"void add_instruction(Proc *, Instruction *)");
    }
    raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr,
                      proc->linearizer->compiler_state->allocator);
    *(BasicBlock **)(ptr + 0x18) = proc->current_bb;
    if (pseudo != (Pseudo *)0x0) {
      free_temp_pseudo(proc,pseudo,false);
    }
    return target;
  }
  __assert_fail("pseudo->type != PSEUDO_INDEXED",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
}

Assistant:

static Pseudo *instruct_move(Proc *proc, enum opcode op, Pseudo *target, Pseudo *src, unsigned line_number)
{
	Instruction *mov = allocate_instruction(proc, op, line_number);
	Pseudo *tofree = add_instruction_operand(proc, mov, src);
	add_instruction_target(proc, mov, target);
	add_instruction(proc, mov);
	if (tofree)
		free_temp_pseudo(proc, tofree, false);
	return target;
}